

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_refs.h
# Opt level: O0

bool dukglue::detail::RefManager::find_and_push_native_object(duk_context *ctx,void *obj_ptr)

{
  void *ctx_00;
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<void_*const,_unsigned_int>,_false> local_38;
  _Node_iterator_base<std::pair<void_*const,_unsigned_int>,_false> local_30;
  iterator it;
  RefMap *ref_map;
  void *obj_ptr_local;
  duk_context *ctx_local;
  
  ref_map = (RefMap *)obj_ptr;
  obj_ptr_local = ctx;
  it.super__Node_iterator_base<std::pair<void_*const,_unsigned_int>,_false>._M_cur =
       (_Node_iterator_base<std::pair<void_*const,_unsigned_int>,_false>)get_ref_map(ctx);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<void_*,_unsigned_int,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_int>_>_>
       ::find((unordered_map<void_*,_unsigned_int,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_int>_>_>
               *)it.super__Node_iterator_base<std::pair<void_*const,_unsigned_int>,_false>._M_cur,
              &ref_map);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<void_*,_unsigned_int,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_int>_>_>
       ::end(it.super__Node_iterator_base<std::pair<void_*const,_unsigned_int>,_false>._M_cur);
  bVar1 = std::__detail::operator==(&local_30,&local_38);
  if (!bVar1) {
    push_ref_array((duk_context *)obj_ptr_local);
    ctx_00 = obj_ptr_local;
    ppVar2 = std::__detail::_Node_iterator<std::pair<void_*const,_unsigned_int>,_false,_false>::
             operator->((_Node_iterator<std::pair<void_*const,_unsigned_int>,_false,_false> *)
                        &local_30);
    duk_get_prop_index((duk_context *)ctx_00,-1,ppVar2->second);
    duk_remove((duk_context *)obj_ptr_local,-2);
  }
  ctx_local._7_1_ = !bVar1;
  return ctx_local._7_1_;
}

Assistant:

static bool find_and_push_native_object(duk_context* ctx, void* obj_ptr)
			{
				RefMap* ref_map = get_ref_map(ctx);

				const auto it = ref_map->find(obj_ptr);

				if (it == ref_map->end()) {
					return false;
				} else {
					push_ref_array(ctx);
					duk_get_prop_index(ctx, -1, it->second);
					duk_remove(ctx, -2);
					return true;
				}
			}